

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

bool __thiscall helics::Federate::getFlagOption(Federate *this,int flag)

{
  element_type *peVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  
  if (flag == 0x1b) {
    return this->singleThreadFederate;
  }
  if (flag != 0x6a) {
    if (flag == 0x4f) {
      return this->useJsonSerialization;
    }
    peVar1 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    UNRECOVERED_JUMPTABLE = peVar1->_vptr_Core[0x23];
    iVar2 = (*UNRECOVERED_JUMPTABLE)
                      (peVar1,(ulong)(uint)(this->fedID).fid,(ulong)(uint)flag,UNRECOVERED_JUMPTABLE
                      );
    return SUB41(iVar2,0);
  }
  return this->retriggerTimeRequest;
}

Assistant:

bool Federate::getFlagOption(int flag) const
{
    switch (flag) {
        case defs::Flags::USE_JSON_SERIALIZATION:
            return useJsonSerialization;
        case defs::Flags::AUTOMATED_TIME_REQUEST:
            return retriggerTimeRequest;
        case defs::Flags::SINGLE_THREAD_FEDERATE:
            return singleThreadFederate;
        default:
            return coreObject->getFlagOption(fedID, flag);
    }
}